

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> * __thiscall
cmTarget::GetUtilityItems(cmTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  cmTargetInternals *pcVar2;
  reference n;
  reference name;
  cmTarget *t;
  cmLinkItem local_48;
  _Self local_20;
  _Self local_18;
  const_iterator i;
  cmTarget *this_local;
  
  i._M_node = (_Base_ptr)this;
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  if ((pcVar2->UtilityItemsDone & 1U) == 0) {
    pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
    pcVar2->UtilityItemsDone = true;
    local_18._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Utilities);
    while( true ) {
      local_20._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Utilities);
      bVar1 = std::operator!=(&local_18,&local_20);
      if (!bVar1) break;
      pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
      n = std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&local_18);
      this_00 = this->Makefile;
      name = std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_18);
      t = cmMakefile::FindTargetToUse(this_00,name,false);
      cmLinkItem::cmLinkItem(&local_48,n,t);
      std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                (&pcVar2->UtilityItems,&local_48);
      cmLinkItem::~cmLinkItem(&local_48);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_18);
    }
  }
  pcVar2 = cmTargetInternalPointer::operator->(&this->Internal);
  return &pcVar2->UtilityItems;
}

Assistant:

std::set<cmLinkItem> const& cmTarget::GetUtilityItems() const
{
  if(!this->Internal->UtilityItemsDone)
    {
    this->Internal->UtilityItemsDone = true;
    for(std::set<std::string>::const_iterator i = this->Utilities.begin();
        i != this->Utilities.end(); ++i)
      {
      this->Internal->UtilityItems.insert(
        cmLinkItem(*i, this->Makefile->FindTargetToUse(*i)));
      }
    }
  return this->Internal->UtilityItems;
}